

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O3

void __thiscall
icu_63::DecimalFormat::doFastFormatInt32
          (DecimalFormat *this,int32_t input,bool isNegative,UnicodeString *output)

{
  char cVar1;
  UChar UVar2;
  DecimalFormatFields *pDVar3;
  div_t dVar4;
  undefined7 in_register_00000011;
  char cVar5;
  char cVar6;
  UChar *srcChars;
  char16_t localBuffer [13];
  char16_t local_58 [13];
  UChar local_3e [7];
  
  dVar4.rem = 0;
  dVar4.quot = input;
  if ((int)CONCAT71(in_register_00000011,isNegative) != 0) {
    local_58[0] = (this->fields->fastData).cpMinusSign;
    UnicodeString::doAppend(output,local_58,0,1);
    dVar4.quot = -input;
    dVar4.rem = 0;
  }
  srcChars = local_3e;
  pDVar3 = this->fields;
  cVar1 = (pDVar3->fastData).maxInt;
  if ('\0' < cVar1) {
    cVar5 = '\0';
    cVar6 = '\0';
    do {
      if ((dVar4.quot == 0) && ((pDVar3->fastData).minInt <= cVar6)) break;
      if (cVar5 == '\x03') {
        UVar2 = (pDVar3->fastData).cpGroupingSeparator;
        if (UVar2 == L'\0') {
          cVar5 = '\x04';
        }
        else {
          srcChars[-1] = UVar2;
          srcChars = srcChars + -1;
          cVar5 = '\x01';
        }
      }
      else {
        cVar5 = cVar5 + '\x01';
      }
      dVar4 = div(dVar4.quot,10);
      srcChars[-1] = (short)dVar4.rem + (pDVar3->fastData).cpZero;
      srcChars = srcChars + -1;
      cVar6 = cVar6 + '\x01';
    } while (cVar1 != cVar6);
  }
  UnicodeString::doAppend
            (output,srcChars,0,0xd - (int)((ulong)((long)srcChars - (long)local_58) >> 1));
  return;
}

Assistant:

void DecimalFormat::doFastFormatInt32(int32_t input, bool isNegative, UnicodeString& output) const {
    U_ASSERT(fields->canUseFastFormat);
    if (isNegative) {
        output.append(fields->fastData.cpMinusSign);
        U_ASSERT(input != INT32_MIN);  // handled by callers
        input = -input;
    }
    // Cap at int32_t to make the buffer small and operations fast.
    // Longest string: "2,147,483,648" (13 chars in length)
    static constexpr int32_t localCapacity = 13;
    char16_t localBuffer[localCapacity];
    char16_t* ptr = localBuffer + localCapacity;
    int8_t group = 0;
    for (int8_t i = 0; i < fields->fastData.maxInt && (input != 0 || i < fields->fastData.minInt); i++) {
        if (group++ == 3 && fields->fastData.cpGroupingSeparator != 0) {
            *(--ptr) = fields->fastData.cpGroupingSeparator;
            group = 1;
        }
        std::div_t res = std::div(input, 10);
        *(--ptr) = static_cast<char16_t>(fields->fastData.cpZero + res.rem);
        input = res.quot;
    }
    int32_t len = localCapacity - static_cast<int32_t>(ptr - localBuffer);
    output.append(ptr, len);
}